

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ControlledLifetimeResource.h
# Opt level: O1

void __thiscall
Rml::ControlledLifetimeResource<Rml::ElementMetaPool>::Shutdown
          (ControlledLifetimeResource<Rml::ElementMetaPool> *this)

{
  Pool<Rml::ElementMeta> *this_00;
  code *pcVar1;
  bool bVar2;
  
  if (this->pointer == (ElementMetaPool *)0x0) {
    bVar2 = Assert("Shutting down resource that was not initialized, or has been shut down already."
                   ,
                   "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/ControlledLifetimeResource.h"
                   ,0x3e);
    if (!bVar2) goto LAB_0022df2f;
  }
  if (this->intentionally_leaked == true) {
    bVar2 = Assert("Shutting down resource that was marked as leaked.",
                   "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/ControlledLifetimeResource.h"
                   ,0x3f);
    if (!bVar2) {
LAB_0022df2f:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
  }
  this_00 = &this->pointer->pool;
  if (this_00 != (Pool<Rml::ElementMeta> *)0x0) {
    Pool<Rml::ElementMeta>::~Pool(this_00);
    operator_delete(this_00,0x28);
  }
  this->pointer = (ElementMetaPool *)0x0;
  return;
}

Assistant:

void Shutdown()
	{
		RMLUI_ASSERTMSG(pointer, "Shutting down resource that was not initialized, or has been shut down already.");
		RMLUI_ASSERTMSG(!intentionally_leaked, "Shutting down resource that was marked as leaked.");
		delete pointer;
		pointer = nullptr;
	}